

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O2

void __thiscall
QColorTransformPrivate::applyConvertIn<unsigned_char>
          (QColorTransformPrivate *this,uchar *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  QColorSpacePrivate *pQVar1;
  element_type *peVar2;
  bool bVar3;
  float *pfVar4;
  long lVar5;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *element;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *__variants;
  long lVar6;
  long in_FS_OFFSET;
  float fVar7;
  QColorVector QVar8;
  QColorVector *local_50;
  undefined8 local_48;
  qsizetype qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = buffer;
  bVar3 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceIn).d.ptr);
  if (bVar3) {
    pQVar1 = (this->colorSpaceIn).d.ptr;
    if ((pQVar1->colorModel == Gray) ||
       ((peVar2 = (pQVar1->lut).table[0].
                  super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar2 == (pQVar1->lut).table[1].
                  super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr &&
        (peVar2 == (pQVar1->lut).table[2].
                   super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr)))) {
      lVar6 = 0;
      lVar5 = 0;
      if (0 < len) {
        lVar5 = len;
      }
      pfVar4 = &buffer->z;
      for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        fVar7 = QColorTrcLut::u8ToLinearF32
                          ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                           super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (uint)src[lVar6]);
        QVar8 = QColorVector::operator*(&((this->colorSpaceIn).d.ptr)->whitePoint,fVar7);
        *(QColorVector *)(pfVar4 + -2) = QVar8;
        pfVar4 = pfVar4 + 4;
      }
    }
    else {
      lVar6 = 0;
      lVar5 = 0;
      if (0 < len) {
        lVar5 = len;
      }
      pfVar4 = &buffer->z;
      for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        local_48 = (QColorVector **)0x0;
        qStack_40 = 0;
        fVar7 = QColorTrcLut::u8ToLinearF32
                          ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                           super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (uint)src[lVar6]);
        local_48 = (QColorVector **)CONCAT44(local_48._4_4_,fVar7);
        fVar7 = QColorTrcLut::u8ToLinearF32
                          ((((this->colorSpaceIn).d.ptr)->lut).table[1].
                           super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (uint)src[lVar6]);
        local_48 = (QColorVector **)CONCAT44(fVar7,(float)local_48);
        fVar7 = QColorTrcLut::u8ToLinearF32
                          ((((this->colorSpaceIn).d.ptr)->lut).table[2].
                           super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (uint)src[lVar6]);
        qStack_40 = CONCAT44(qStack_40._4_4_,fVar7);
        QVar8 = QColorMatrix::map(&((this->colorSpaceIn).d.ptr)->toXyz,(QColorVector *)&local_48);
        *(QColorVector *)(pfVar4 + -2) = QVar8;
        pfVar4 = pfVar4 + 4;
      }
    }
    bVar3 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceOut).d.ptr);
    pQVar1 = (this->colorSpaceIn).d.ptr;
    if ((!bVar3) || (pQVar1->colorModel != Gray)) {
      bVar3 = QColorMatrix::isNull(&pQVar1->chad);
      if (!bVar3) {
        applyMatrix<(ApplyMatrixForm)1>(buffer,len,&((this->colorSpaceIn).d.ptr)->chad);
      }
    }
  }
  else {
    loadUnpremultipliedLUT(buffer,src,len);
    pQVar1 = (this->colorSpaceIn).d.ptr;
    __variants = (pQVar1->mAB).d.ptr;
    for (lVar5 = (pQVar1->mAB).d.size * 0x1c8; lVar5 != 0; lVar5 = lVar5 + -0x1c8) {
      local_48 = &local_50;
      qStack_40 = len;
      std::
      visit<QColorTransformPrivate::applyConvertIn<unsigned_char>(unsigned_char_const*,QColorVector*,long_long,QFlags<QColorTransformPrivate::TransformFlag>)const::_lambda(auto:1&&)_1_,std::variant<QColorSpacePrivate::TransferElement,QColorMatrix,QColorVector,QColorCLUT>const&>
                ((anon_class_16_2_4b7f43a0 *)&local_48,__variants);
      __variants = __variants + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}